

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TesterThread::AllocateObject(TesterThread *this)

{
  pointer *ppOVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  undefined1 auStack_30 [8];
  Object object;
  
  lVar2 = random();
  lVar3 = random();
  object.ptr._0_4_ =
       (int)(lVar3 % (long)(ulong)(uint)(1 << ((char)lVar2 +
                                               ((char)(SUB164(SEXT816(lVar2) *
                                                              SEXT816(0x7878787878787879),8) >> 3) -
                                               (SUB161(SEXT816(lVar2) * SEXT816(0x7878787878787879),
                                                       0xf) >> 7)) * -0x11 & 0x1fU)));
  auStack_30 = (undefined1  [8])AllocatorState::alloc(&this->rnd_,(long)(int)object.ptr);
  if (auStack_30 != (undefined1  [8])0x0) {
    object.ptr._4_4_ = 0;
    FillContents(this,(Object *)auStack_30);
    __position._M_current =
         (this->heap_).
         super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->heap_).
        super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<TesterThread::Object,std::allocator<TesterThread::Object>>::
      _M_realloc_insert<TesterThread::Object_const&>
                ((vector<TesterThread::Object,std::allocator<TesterThread::Object>> *)&this->heap_,
                 __position,(Object *)auStack_30);
    }
    else {
      (__position._M_current)->ptr = (char *)auStack_30;
      (__position._M_current)->size = (int)object.ptr;
      (__position._M_current)->generation = object.ptr._4_4_;
      ppOVar1 = &(this->heap_).
                 super__Vector_base<TesterThread::Object,_std::allocator<TesterThread::Object>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppOVar1 = *ppOVar1 + 1;
    }
    this->heap_size_ = this->heap_size_ + (long)(int)object.ptr;
    return;
  }
  syscall(1,2,"Check failed: object.ptr\n",0x19);
  abort();
}

Assistant:

void AllocateObject() {
    Object object;
    object.size = rnd_.Skewed(FLAGS_lgmaxsize);
    object.ptr = static_cast<char*>(rnd_.alloc(object.size));
    CHECK(object.ptr);
    object.generation = 0;
    FillContents(&object);
    heap_.push_back(object);
    heap_size_ += object.size;
  }